

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind.cc
# Opt level: O1

bool absl::lts_20250127::str_format_internal::FormatUntyped
               (FormatRawSinkImpl raw_sink,UntypedFormatSpecImpl format,
               Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args)

{
  byte *p;
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  void *pvVar5;
  size_t sVar6;
  int *next_arg_00;
  char *pcVar7;
  undefined8 extraout_RDX;
  size_t extraout_RDX_00;
  byte *extraout_RDX_02;
  byte unaff_BL;
  char *pcVar8;
  ConversionItem *item;
  byte *pbVar9;
  char *pcVar10;
  byte bVar11;
  byte *__s;
  char *pcVar12;
  string_view v;
  string_view v_00;
  string_view v_01;
  string_view v_02;
  string_view conv_string;
  string_view conv_string_00;
  string_view conv_string_01;
  int next_arg;
  FormatSinkImpl sink;
  int local_47c;
  UnboundConversion local_478;
  ConverterConsumer<absl::lts_20250127::str_format_internal::(anonymous_namespace)::DefaultConverter>
  local_468;
  FormatSinkImpl local_450;
  byte *extraout_RDX_01;
  
  local_468.arg_context_.pack_.len_ = args.len_;
  local_468.arg_context_.pack_.ptr_ = args.ptr_;
  local_450.raw_.write_ = raw_sink.write_;
  local_450.raw_.sink_ = raw_sink.sink_;
  sVar6 = format.size_;
  __s = (byte *)format.data_;
  local_450.pos_ = local_450.buf_;
  local_450.size_ = 0;
  if (sVar6 == 0xffffffffffffffff) {
    local_468.converter_.sink_ = &local_450;
    pcVar10 = *(char **)(__s + 0x10);
    pcVar1 = *(char **)(__s + 0x18);
    if (pcVar10 != pcVar1) {
      pcVar2 = *(char **)(__s + 8);
      pcVar8 = (char *)0x0;
      pcVar7 = (char *)0xffffffffffffffff;
      pbVar9 = __s;
      pcVar12 = pcVar2;
      do {
        pcVar12 = pcVar12 + (long)pcVar8;
        pcVar8 = pcVar2 + (*(long *)(pcVar10 + 8) - (long)pcVar12);
        if (*pcVar10 == '\x01') {
          conv_string_01._M_str = pcVar7;
          conv_string_01._M_len = (size_t)pbVar9;
          bVar4 = anon_unknown_3::
                  ConverterConsumer<absl::lts_20250127::str_format_internal::(anonymous_namespace)::DefaultConverter>
                  ::ConvertOne(&local_468,(UnboundConversion *)(pcVar10 + 0x10),conv_string_01);
          pbVar9 = extraout_RDX_01;
          if (!bVar4) {
            bVar11 = 0;
            goto LAB_00385f43;
          }
        }
        else {
          v_02._M_str = pcVar12;
          v_02._M_len = (size_t)pcVar8;
          FormatSinkImpl::Append(local_468.converter_.sink_,v_02);
          pbVar9 = extraout_RDX_02;
        }
        pcVar10 = pcVar10 + 0x20;
      } while (pcVar10 != pcVar1);
    }
    bVar11 = *__s ^ 1;
  }
  else {
    local_468.converter_.sink_ = &local_450;
    local_47c = 0;
    bVar11 = 1;
    if (sVar6 != 0) {
      pbVar9 = __s + sVar6;
      do {
        pvVar5 = memchr(__s,0x25,(long)pbVar9 - (long)__s);
        if (pvVar5 == (void *)0x0) {
          v_00._M_str = (char *)__s;
          v_00._M_len = (long)pbVar9 - (long)__s;
          FormatSinkImpl::Append(local_468.converter_.sink_,v_00);
          bVar4 = true;
          unaff_BL = 1;
        }
        else {
          v._M_len = (long)pvVar5 - (long)__s;
          v._M_str = (char *)__s;
          FormatSinkImpl::Append(local_468.converter_.sink_,v);
          p = (byte *)((long)pvVar5 + 1);
          bVar4 = true;
          if (p < pbVar9) {
            if ((char)ConvTagHolder::value[*p].tag_ < '\0') {
              if (*p == 0x25) {
                v_01._M_str = "%";
                v_01._M_len = 1;
                FormatSinkImpl::Append(local_468.converter_.sink_,v_01);
                __s = (byte *)((long)pvVar5 + 2);
                bVar4 = false;
              }
              else {
                local_478.width.value_ = -1;
                local_478.precision.value_ = -1;
                local_478.flags = kBasic;
                local_478.length_mod = none;
                local_478.conv = v|s;
                next_arg_00 = &local_47c;
                __s = (byte *)ConsumeUnboundConversionNoInline
                                        ((char *)p,(char *)pbVar9,&local_478,next_arg_00);
                if (__s == (byte *)0x0) {
                  unaff_BL = 0;
                  bVar3 = false;
                }
                else {
                  conv_string_00._M_str = (char *)next_arg_00;
                  conv_string_00._M_len = extraout_RDX_00;
                  bVar3 = anon_unknown_3::
                          ConverterConsumer<absl::lts_20250127::str_format_internal::(anonymous_namespace)::DefaultConverter>
                          ::ConvertOne(&local_468,&local_478,conv_string_00);
                  unaff_BL = unaff_BL & bVar3;
                }
                if (bVar3 != false) goto LAB_00385e9f;
              }
            }
            else {
              if (local_47c < 0) goto LAB_00385eba;
              local_478.width.value_ = -1;
              local_478.precision.value_ = -1;
              local_478.flags = kBasic;
              local_478.length_mod = none;
              conv_string._M_str._0_4_ = local_47c + 1;
              conv_string._M_len = extraout_RDX;
              conv_string._M_str._4_4_ = 0;
              local_47c = (int)conv_string._M_str;
              local_478.arg_position = (int)conv_string._M_str;
              local_478.conv = ConvTagHolder::value[*p].tag_;
              bVar3 = anon_unknown_3::
                      ConverterConsumer<absl::lts_20250127::str_format_internal::(anonymous_namespace)::DefaultConverter>
                      ::ConvertOne(&local_468,&local_478,conv_string);
              __s = (byte *)((long)pvVar5 + 2);
              unaff_BL = unaff_BL & bVar3;
              if (bVar3) {
LAB_00385e9f:
                bVar4 = false;
              }
            }
          }
          else {
LAB_00385eba:
            unaff_BL = 0;
          }
        }
        bVar11 = unaff_BL;
      } while ((!bVar4) && (bVar11 = 1, __s != pbVar9));
    }
  }
LAB_00385f43:
  FormatSinkImpl::~FormatSinkImpl(&local_450);
  return (bool)(bVar11 & 1);
}

Assistant:

bool FormatUntyped(FormatRawSinkImpl raw_sink,
                   const UntypedFormatSpecImpl format,
                   absl::Span<const FormatArgImpl> args) {
  FormatSinkImpl sink(raw_sink);
  using Converter = DefaultConverter;
  return ConvertAll(format, args, Converter(&sink));
}